

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadAccessor(ColladaParser *this,string *pID)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var_00;
  size_type sVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  allocator local_489;
  string local_488;
  char *local_468;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_460 [376];
  string local_2e8;
  allocator local_2c1;
  undefined1 local_2c0 [8];
  string type;
  undefined1 local_298 [4];
  int attrType;
  string name;
  int attrName;
  Accessor *acc;
  uint local_1e4;
  uint local_1e0;
  uint stride;
  int attrStride;
  uint offset;
  int attrOffset;
  uint count;
  int attrCount;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1c0 [376];
  string local_48;
  char *local_28;
  char *source;
  string *psStack_18;
  int attrSource;
  string *pID_local;
  ColladaParser *this_local;
  
  psStack_18 = pID;
  pID_local = &this->mFileName;
  source._4_4_ = GetAttribute(this,"source");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)source._4_4_);
  local_28 = (char *)CONCAT44(extraout_var,iVar2);
  if (*local_28 != '#') {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(local_1c0,(char (*) [34])"Unknown reference format in url \"");
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,&local_28);
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,(char (*) [45])"\" in source attribute of <accessor> element.");
    Formatter::basic_formatter::operator_cast_to_string(&local_48,pbVar5);
    ThrowException(this,&local_48);
  }
  attrOffset = GetAttribute(this,"count");
  offset = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)(uint)attrOffset);
  attrStride = TestAttribute(this,"offset");
  stride = 0;
  if (-1 < attrStride) {
    stride = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)(uint)attrStride);
  }
  local_1e0 = TestAttribute(this,"stride");
  local_1e4 = 1;
  if (-1 < (int)local_1e0) {
    local_1e4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)local_1e0);
  }
  Collada::Accessor::Accessor((Accessor *)&acc);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
           ::operator[](&this->mAccessorLibrary,psStack_18);
  Collada::Accessor::operator=(pmVar6,(Accessor *)&acc);
  Collada::Accessor::~Accessor((Accessor *)&acc);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
           ::operator[](&this->mAccessorLibrary,psStack_18);
  pmVar6->mCount = (ulong)offset;
  pmVar6->mOffset = (ulong)stride;
  pmVar6->mStride = (ulong)local_1e4;
  std::__cxx11::string::operator=((string *)&pmVar6->mSource,local_28 + 1);
  pmVar6->mSize = 0;
  while( true ) {
    while( true ) {
      uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((uVar3 & 1) == 0) {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) break;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"accessor");
        if (iVar2 == 0) {
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_488,"Expected end of <accessor> element.",&local_489);
        ThrowException(this,&local_488);
      }
    }
    bVar1 = IsElement(this,"param");
    if (!bVar1) break;
    name.field_2._12_4_ = TestAttribute(this,"name");
    std::__cxx11::string::string((string *)local_298);
    if (-1 < (int)name.field_2._12_4_) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                        (this->mReader,(ulong)(uint)name.field_2._12_4_);
      std::__cxx11::string::operator=((string *)local_298,(char *)CONCAT44(extraout_var_00,iVar2));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_298,"X");
      if (bVar1) {
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&pmVar6->mParams);
        pmVar6->mSubOffset[0] = sVar7;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_298,"Y");
        if (bVar1) {
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&pmVar6->mParams);
          pmVar6->mSubOffset[1] = sVar7;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_298,"Z");
          if (bVar1) {
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&pmVar6->mParams);
            pmVar6->mSubOffset[2] = sVar7;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_298,"R");
            if (bVar1) {
              sVar7 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&pmVar6->mParams);
              pmVar6->mSubOffset[0] = sVar7;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_298,"G");
              if (bVar1) {
                sVar7 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&pmVar6->mParams);
                pmVar6->mSubOffset[1] = sVar7;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_298,"B");
                if (bVar1) {
                  sVar7 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&pmVar6->mParams);
                  pmVar6->mSubOffset[2] = sVar7;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_298,"A");
                  if (bVar1) {
                    sVar7 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(&pmVar6->mParams);
                    pmVar6->mSubOffset[3] = sVar7;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_298,"S");
                    if (bVar1) {
                      sVar7 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::size(&pmVar6->mParams);
                      pmVar6->mSubOffset[0] = sVar7;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_298,"T");
                      if (bVar1) {
                        sVar7 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(&pmVar6->mParams);
                        pmVar6->mSubOffset[1] = sVar7;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_298,"P");
                        if (bVar1) {
                          sVar7 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::size(&pmVar6->mParams);
                          pmVar6->mSubOffset[2] = sVar7;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_298,"U");
                          if (bVar1) {
                            sVar7 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size(&pmVar6->mParams);
                            pmVar6->mSubOffset[0] = sVar7;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_298,"V");
                            if (bVar1) {
                              sVar7 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::size(&pmVar6->mParams);
                              pmVar6->mSubOffset[1] = sVar7;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    type.field_2._12_4_ = TestAttribute(this,"type");
    if (-1 < (int)type.field_2._12_4_) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                        (this->mReader,(ulong)(uint)type.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2c0,(char *)CONCAT44(extraout_var_01,iVar2),&local_2c1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2c0,"float4x4");
      if (bVar1) {
        pmVar6->mSize = pmVar6->mSize + 0x10;
      }
      else {
        pmVar6->mSize = pmVar6->mSize + 1;
      }
      std::__cxx11::string::~string((string *)local_2c0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pmVar6->mParams,(value_type *)local_298);
    SkipElement(this);
    std::__cxx11::string::~string((string *)local_298);
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_460,(char (*) [25])"Unexpected sub element <");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  local_468 = (char *)CONCAT44(extraout_var_02,iVar2);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,&local_468);
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,(char (*) [20])"> in tag <accessor>");
  Formatter::basic_formatter::operator_cast_to_string(&local_2e8,pbVar5);
  ThrowException(this,&local_2e8);
}

Assistant:

void ColladaParser::ReadAccessor(const std::string& pID)
{
    // read accessor attributes
    int attrSource = GetAttribute("source");
    const char* source = mReader->getAttributeValue(attrSource);
    if (source[0] != '#')
        ThrowException(format() << "Unknown reference format in url \"" << source << "\" in source attribute of <accessor> element.");
    int attrCount = GetAttribute("count");
    unsigned int count = (unsigned int)mReader->getAttributeValueAsInt(attrCount);
    int attrOffset = TestAttribute("offset");
    unsigned int offset = 0;
    if (attrOffset > -1)
        offset = (unsigned int)mReader->getAttributeValueAsInt(attrOffset);
    int attrStride = TestAttribute("stride");
    unsigned int stride = 1;
    if (attrStride > -1)
        stride = (unsigned int)mReader->getAttributeValueAsInt(attrStride);

    // store in the library under the given ID
    mAccessorLibrary[pID] = Accessor();
    Accessor& acc = mAccessorLibrary[pID];
    acc.mCount = count;
    acc.mOffset = offset;
    acc.mStride = stride;
    acc.mSource = source + 1; // ignore the leading '#'
    acc.mSize = 0; // gets incremented with every param

    // and read the components
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("param"))
            {
                // read data param
                int attrName = TestAttribute("name");
                std::string name;
                if (attrName > -1)
                {
                    name = mReader->getAttributeValue(attrName);

                    // analyse for common type components and store it's sub-offset in the corresponding field

                    /* Cartesian coordinates */
                    if (name == "X") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "Y") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "Z") acc.mSubOffset[2] = acc.mParams.size();

                    /* RGBA colors */
                    else if (name == "R") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "G") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "B") acc.mSubOffset[2] = acc.mParams.size();
                    else if (name == "A") acc.mSubOffset[3] = acc.mParams.size();

                    /* UVWQ (STPQ) texture coordinates */
                    else if (name == "S") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "T") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "P") acc.mSubOffset[2] = acc.mParams.size();
                    //  else if( name == "Q") acc.mSubOffset[3] = acc.mParams.size();
                        /* 4D uv coordinates are not supported in Assimp */

                        /* Generic extra data, interpreted as UV data, too*/
                    else if (name == "U") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "V") acc.mSubOffset[1] = acc.mParams.size();
                    //else
                    //  DefaultLogger::get()->warn( format() << "Unknown accessor parameter \"" << name << "\". Ignoring data channel." );
                }

                // read data type
                int attrType = TestAttribute("type");
                if (attrType > -1)
                {
                    // for the moment we only distinguish between a 4x4 matrix and anything else.
                    // TODO: (thom) I don't have a spec here at work. Check if there are other multi-value types
                    // which should be tested for here.
                    std::string type = mReader->getAttributeValue(attrType);
                    if (type == "float4x4")
                        acc.mSize += 16;
                    else
                        acc.mSize += 1;
                }

                acc.mParams.push_back(name);

                // skip remaining stuff of this element, if any
                SkipElement();
            }
            else
            {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <accessor>");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "accessor") != 0)
                ThrowException("Expected end of <accessor> element.");
            break;
        }
    }
}